

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O2

void spdlog::details::os::_thread_name(char *name,size_t length)

{
  int iVar1;
  spdlog_ex *psVar2;
  int *piVar3;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (length < 0x10) {
    psVar2 = (spdlog_ex *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_38,"Error! Insufficient buffer length.",(allocator *)&local_58);
    spdlog_ex::spdlog_ex(psVar2,&local_38);
    __cxa_throw(psVar2,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
  }
  iVar1 = prctl(0x10,name);
  if (iVar1 != -1) {
    return;
  }
  psVar2 = (spdlog_ex *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_58,"Warning! Thread name get failed.",&local_59);
  piVar3 = __errno_location();
  spdlog_ex::spdlog_ex(psVar2,&local_58,*piVar3);
  __cxa_throw(psVar2,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

inline void _thread_name(char * name, size_t length)
{    
#ifdef _WIN32
    HANDLE threadHandle = ::OpenThread(THREAD_QUERY_INFORMATION, false, static_cast<DWORD>(thread_id()));
    if (threadHandle)
    {
	wchar_t* data;
	HRESULT hr = ::GetThreadDescription(threadHandle, &data);
	if (SUCCEEDED(hr))
	{ 
	    std::wcstombs(name, data, length);
	    ::LocalFree(data);
	}
    }

    ::CloseHandle(threadHandle);
#else
    static const size_t    THREAD_NAME_LENGTH = 16;  // Length is restricted by the OS. Includes null-termination.
    
    if (THREAD_NAME_LENGTH <= length)
    {
        int retval = 0;
        
        retval = prctl(PR_GET_NAME, name);
        if (-1 == retval)
        {
	    throw spdlog_ex("Warning! Thread name get failed.", errno);
        }
    }
    else
    {
        throw spdlog_ex("Error! Insufficient buffer length.");
    }
#endif
}